

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MAW.cpp
# Opt level: O0

void __thiscall
OpenMD::MAW::addExplicitInteraction
          (MAW *this,AtomType *atype1,AtomType *atype2,RealType De,RealType beta,RealType Re,
          RealType ca1,RealType cb1)

{
  int iVar1;
  reference pvVar2;
  AtomType *this_00;
  reference pvVar3;
  reference pvVar4;
  AtomType *in_RDX;
  AtomType *in_RSI;
  long in_RDI;
  vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_> *in_XMM0_Qa;
  int nM;
  int mtid2;
  int mtid1;
  MAWInteractionData mixer;
  AtomType *in_stack_ffffffffffffff70;
  value_type vVar5;
  value_type vVar6;
  
  AtomType::isMetal(in_stack_ffffffffffffff70);
  iVar1 = AtomType::getIdent(in_RSI);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)iVar1);
  vVar6 = *pvVar2;
  this_00 = (AtomType *)(in_RDI + 0x40);
  iVar1 = AtomType::getIdent(in_RDX);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)this_00,(long)iVar1);
  vVar5 = *pvVar2;
  std::set<int,_std::less<int>,_std::allocator<int>_>::size
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x305917);
  std::
  vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
  ::resize((vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
            *)in_XMM0_Qa,CONCAT44(vVar6,vVar5));
  std::
  vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
  ::operator[]((vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
                *)(in_RDI + 0x58),(long)vVar6);
  std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>::resize
            (in_XMM0_Qa,CONCAT44(vVar6,vVar5));
  pvVar3 = std::
           vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
           ::operator[]((vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
                         *)(in_RDI + 0x58),(long)vVar6);
  pvVar4 = std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>::
           operator[](pvVar3,(long)vVar5);
  memcpy(pvVar4,&stack0xffffffffffffff90,0x30);
  if (vVar5 != vVar6) {
    std::
    vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
    ::operator[]((vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
                  *)(in_RDI + 0x58),(long)vVar5);
    std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>::resize
              (in_XMM0_Qa,CONCAT44(vVar6,vVar5));
    AtomType::isMetal(this_00);
    pvVar3 = std::
             vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
             ::operator[]((vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
                           *)(in_RDI + 0x58),(long)vVar5);
    pvVar4 = std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>::
             operator[](pvVar3,(long)vVar6);
    memcpy(pvVar4,&stack0xffffffffffffff90,0x30);
  }
  return;
}

Assistant:

void MAW::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                   RealType De, RealType beta, RealType Re,
                                   RealType ca1, RealType cb1) {
    MAWInteractionData mixer;
    mixer.De         = De;
    mixer.beta       = beta;
    mixer.Re         = Re;
    mixer.ca1        = ca1;
    mixer.cb1        = cb1;
    mixer.j_is_Metal = atype2->isMetal();

    int mtid1 = MAWtids[atype1->getIdent()];
    int mtid2 = MAWtids[atype2->getIdent()];
    int nM    = MAWtypes.size();

    MixingMap.resize(nM);
    MixingMap[mtid1].resize(nM);

    MixingMap[mtid1][mtid2] = mixer;
    if (mtid2 != mtid1) {
      MixingMap[mtid2].resize(nM);
      mixer.j_is_Metal        = atype1->isMetal();
      MixingMap[mtid2][mtid1] = mixer;
    }
  }